

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::const_compare(char *str1,vm_val_t *val)

{
  int iVar1;
  char *bytelen2;
  int *in_RSI;
  char *in_RDI;
  size_t len2;
  size_t len1;
  char *str2;
  vm_val_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((*in_RSI == 5) && (iVar1 = CVmObjStringBuffer::is_string_buffer_obj(0), iVar1 != 0)) {
    vm_objp(0);
    iVar1 = CVmObjStringBuffer::compare_str
                      ((CVmObjStringBuffer *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    return -iVar1;
  }
  bytelen2 = vm_val_t::get_as_string(in_stack_ffffffffffffffc8);
  if (bytelen2 != (char *)0x0) {
    vmb_get_len((char *)0x39362b);
    vmb_get_len((char *)0x39363a);
    iVar1 = utf8_ptr::s_compare_to
                      ((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)in_RDI,(char *)in_RSI,(size_t)bytelen2);
    return iVar1;
  }
  err_throw(0);
}

Assistant:

int CVmObjString::const_compare(VMG_ const char *str1, const vm_val_t *val)
{
    const char *str2;
    size_t len1, len2;

    /* if the other value is a string buffer, compare to its contents */
    if (val->typ == VM_OBJ
        && CVmObjStringBuffer::is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* 
         *   ask the string buffer to do the comparison, but reverse the
         *   sense of the comparison, since from its perspective the
         *   comparison is in the opposite order 
         */
        return -((CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj))
            ->compare_str(str1);
    }

    /* get the other value as a string */
    str2 = val->get_as_string(vmg0_);

    /* if it's not a string, we can't compare it */
    if (str2 == 0)
        err_throw(VMERR_INVALID_COMPARISON);

    /* get the lengths of the two strings */
    len1 = vmb_get_len(str1);
    len2 = vmb_get_len(str2);

    /* perform a lexical comparison and return the result */
    return utf8_ptr::s_compare_to(str1 + VMB_LEN, len1, str2 + VMB_LEN, len2);
}